

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationSubContext::~IfcGeometricRepresentationSubContext
          (IfcGeometricRepresentationSubContext *this)

{
  ~IfcGeometricRepresentationSubContext
            ((IfcGeometricRepresentationSubContext *)
             &this[-1].super_IfcGeometricRepresentationContext.WorldCoordinateSystem);
  return;
}

Assistant:

IfcGeometricRepresentationSubContext() : Object("IfcGeometricRepresentationSubContext") {}